

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cosine_window.cc
# Opt level: O2

void __thiscall
sptk::CosineWindow::CosineWindow
          (CosineWindow *this,int window_length,vector<double,_std::allocator<double>_> *alpha,
          bool periodic)

{
  double dVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer pdVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  int k;
  long lVar9;
  double dVar10;
  double dVar11;
  
  (this->super_WindowInterface)._vptr_WindowInterface = (_func_int **)&PTR__CosineWindow_00111d10;
  this->window_length_ = window_length;
  this->periodic_ = periodic;
  this->is_valid_ = true;
  (this->window_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->window_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->window_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((window_length < 1) ||
     ((alpha->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_start ==
      (alpha->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_finish)) {
    this->is_valid_ = false;
  }
  else {
    std::vector<double,_std::allocator<double>_>::resize(&this->window_,(ulong)(uint)window_length);
    iVar8 = this->window_length_;
    if (iVar8 == 1) {
      *(this->window_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start = 1.0;
    }
    else {
      pdVar2 = (alpha->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      pdVar3 = (alpha->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      iVar6 = iVar8 - (this->periodic_ ^ 1);
      pdVar4 = (this->window_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (uVar7 = 0; (long)uVar7 < (long)iVar8; uVar7 = uVar7 + 1) {
        dVar11 = *(alpha->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        uVar5 = uVar7 & 0xffffffff;
        iVar8 = -1;
        for (lVar9 = 1; lVar9 < (int)((ulong)((long)pdVar2 - (long)pdVar3) >> 3); lVar9 = lVar9 + 1)
        {
          dVar1 = (alpha->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start[lVar9];
          dVar10 = cos((double)(int)uVar5 * (6.283185307179586 / (double)iVar6));
          dVar11 = dVar11 + dVar10 * (double)iVar8 * dVar1;
          iVar8 = -iVar8;
          uVar5 = (ulong)(uint)((int)uVar5 + (int)uVar7);
        }
        pdVar4[uVar7] = dVar11;
        iVar8 = this->window_length_;
      }
    }
  }
  return;
}

Assistant:

CosineWindow::CosineWindow(int window_length, const std::vector<double>& alpha,
                           bool periodic)
    : window_length_(window_length), periodic_(periodic), is_valid_(true) {
  if (window_length_ <= 0 || alpha.empty()) {
    is_valid_ = false;
    return;
  }

  window_.resize(window_length_);
  if (1 == window_length_) {
    window_[0] = 1.0;
    return;
  }

  const int alpha_size(static_cast<int>(alpha.size()));
  const double m(kTwoPi / (periodic_ ? window_length_ : window_length_ - 1));
  double* window(&(window_[0]));
  for (int i(0); i < window_length_; ++i) {
    double sum(alpha[0]);
    int sign(-1);
    for (int k(1); k < alpha_size; ++k) {
      sum += sign * alpha[k] * std::cos(i * k * m);
      sign *= -1;
    }
    window[i] = sum;
  }
}